

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O2

DictionaryStats * __thiscall DictionaryStats::Clone(DictionaryStats *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DictionaryStats *this_00;
  
  this_00 = (DictionaryStats *)
            Memory::NoCheckHeapAllocator::Alloc
                      ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x38);
  DictionaryStats(this_00,this->pName,this->initialSize);
  uVar1 = this->countOfEmptyBuckets;
  uVar2 = this->countOfResize;
  uVar3 = this->itemCount;
  this_00->finalSize = this->finalSize;
  this_00->countOfEmptyBuckets = uVar1;
  this_00->countOfResize = uVar2;
  this_00->itemCount = uVar3;
  uVar1 = this->lookupCount;
  uVar2 = this->collisionCount;
  uVar3 = this->lookupDepthTotal;
  this_00->maxDepth = this->maxDepth;
  this_00->lookupCount = uVar1;
  this_00->collisionCount = uVar2;
  this_00->lookupDepthTotal = uVar3;
  this_00->maxLookupDepth = this->maxLookupDepth;
  this_00->pName = this->pName;
  return this_00;
}

Assistant:

DictionaryStats* DictionaryStats::Clone()
{
    DictionaryStats* cloned = NoCheckHeapNew(DictionaryStats, pName, initialSize);
    cloned->finalSize = finalSize;
    cloned->countOfEmptyBuckets = countOfEmptyBuckets;
    cloned->countOfResize = countOfResize;
    cloned->itemCount = itemCount;
    cloned->maxDepth = maxDepth;
    cloned->lookupCount = lookupCount;
    cloned->collisionCount = collisionCount;
    cloned->lookupDepthTotal = lookupDepthTotal;
    cloned->maxLookupDepth = maxLookupDepth;
    cloned->pName = pName;
    return cloned;
}